

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void el::base::utils::Str::replaceFirstWithEscape
               (string_t *str,string_t *replaceWhat,string_t *replaceWith)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = -1;
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)str,(ulong)(replaceWhat->_M_dataplus)._M_p,lVar2 + 1)
    ;
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    if ((uVar1 == 0) || ((str->_M_dataplus)._M_p[uVar1 - 1] != '%')) break;
    std::__cxx11::string::erase((ulong)str,uVar1 - 1);
    lVar2 = uVar1 + 1;
  }
  std::__cxx11::string::replace
            ((ulong)str,uVar1,(char *)replaceWhat->_M_string_length,
             (ulong)(replaceWith->_M_dataplus)._M_p);
  return;
}

Assistant:

static void replaceFirstWithEscape(base::type::string_t& str, const base::type::string_t& replaceWhat,
                                     const base::type::string_t& replaceWith) {
    std::size_t foundAt = base::type::string_t::npos;
    while ((foundAt = str.find(replaceWhat, foundAt + 1)) != base::type::string_t::npos) {
      if (foundAt > 0 && str[foundAt - 1] == base::consts::kFormatSpecifierChar) {
        str.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
        ++foundAt;
      } else {
        str.replace(foundAt, replaceWhat.length(), replaceWith);
        return;
      }
    }
  }